

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::CanClearByZeroing(FieldDescriptor *field)

{
  FieldDescriptor FVar1;
  uint uVar2;
  string_view name;
  long lVar3;
  string *psVar4;
  bool bVar5;
  Descriptor *descriptor;
  undefined1 uVar6;
  undefined1 *puVar7;
  byte bVar8;
  undefined1 *puVar9;
  char *pcVar10;
  undefined1 uStack_d8;
  undefined7 uStack_d7;
  string sStack_c8;
  AlphaNum AStack_a8;
  AlphaNum AStack_78;
  undefined1 *puStack_48;
  undefined1 auStack_30 [16];
  FieldDescriptor *pFStack_20;
  undefined1 auStack_18 [16];
  
  puVar7 = auStack_18;
  FVar1 = field[1];
  bVar5 = (bool)(((byte)FVar1 & 0x20) >> 5);
  if (0xbf < (byte)FVar1 == bVar5) {
    psVar4 = (string *)0x0;
  }
  else {
    pFStack_20 = (FieldDescriptor *)0x1e5cc9;
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                       (bVar5,0xbf < (byte)FVar1,"is_repeated_ == label() == LABEL_REPEATED");
  }
  if (psVar4 != (string *)0x0) {
    pFStack_20 = (FieldDescriptor *)HasTrivialSwap;
    CanClearByZeroing();
    uVar6 = SUB81(auStack_30,0);
    bVar8 = puVar7[1];
    bVar5 = (bool)((bVar8 & 0x20) >> 5);
    pFStack_20 = field;
    if (0xbf < bVar8 == bVar5) {
      psVar4 = (string *)0x0;
    }
    else {
      psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                         (bVar5,0xbf < bVar8,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (psVar4 == (string *)0x0) {
      if (((puVar7[1] & 0x28) == 0) &&
         (uVar2 = *(uint *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)puVar7[2] * 4),
         uVar2 < 0xb)) {
        bVar8 = (byte)(0x5fe >> ((byte)uVar2 & 0x1f));
      }
      else {
        bVar8 = 0;
      }
      return (bool)(bVar8 & 1);
    }
    HasTrivialSwap();
    pcVar10 = (char *)0x0;
    uStack_d8 = 0;
    puVar9 = &uStack_d8;
    puStack_48 = puVar7;
    if (*(cpp **)(psVar4 + 0x18) != (cpp *)0x0) {
      ClassName_abi_cxx11_(&sStack_c8,*(cpp **)(psVar4 + 0x18),descriptor);
      AStack_a8.piece_._M_len = sStack_c8._M_string_length;
      AStack_a8.piece_._M_str = sStack_c8._M_dataplus._M_p;
      AStack_78.piece_._M_len = 1;
      AStack_78.piece_._M_str = "_";
      absl::lts_20240722::StrAppend((string *)&stack0xffffffffffffff18,&AStack_a8,&AStack_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_c8._M_dataplus._M_p != &sStack_c8.field_2) {
        operator_delete(sStack_c8._M_dataplus._M_p,sStack_c8.field_2._M_allocated_capacity + 1);
      }
    }
    AStack_a8.piece_._M_str = (char *)**(undefined8 **)(psVar4 + 8);
    AStack_a8.piece_._M_len = (*(undefined8 **)(psVar4 + 8))[1];
    absl::lts_20240722::StrAppend((string *)&stack0xffffffffffffff18,&AStack_a8);
    if (*(char *)(*(long *)(psVar4 + 0x20) + 0x53) == '\x01') {
      AStack_a8.piece_._M_len = 9;
      AStack_a8.piece_._M_str = "_DoNotUse";
      absl::lts_20240722::StrAppend((string *)&stack0xffffffffffffff18,&AStack_a8);
    }
    name._M_str = pcVar10;
    name._M_len = (size_t)puVar9;
    ResolveKeyword_abi_cxx11_(name);
    if (puVar9 != &uStack_d8) {
      operator_delete(puVar9,CONCAT71(uStack_d7,uStack_d8) + 1);
    }
    return (bool)uVar6;
  }
  if (((byte)field[1] & 0x28) != 0) {
LAB_001e5cac:
    return false;
  }
  switch(*(undefined4 *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4)) {
  case 1:
  case 3:
    bVar8 = *(int *)(field + 0x50) == 0;
    break;
  case 2:
  case 4:
    bVar8 = *(long *)(field + 0x50) == 0;
    break;
  case 5:
    bVar5 = *(double *)(field + 0x50) == 0.0;
    goto LAB_001e5ca2;
  case 6:
    bVar5 = *(float *)(field + 0x50) == 0.0;
LAB_001e5ca2:
    bVar8 = -bVar5 & 1;
    break;
  case 7:
    bVar8 = (byte)field[0x50] ^ 1;
    break;
  case 8:
    pFStack_20 = (FieldDescriptor *)0x1e5c8c;
    lVar3 = google::protobuf::FieldDescriptor::default_value_enum();
    bVar8 = *(int *)(lVar3 + 4) == 0;
    break;
  default:
    goto LAB_001e5cac;
  }
  return (bool)bVar8;
}

Assistant:

bool CanClearByZeroing(const FieldDescriptor* field) {
  if (field->is_repeated() || field->is_extension()) return false;
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_ENUM:
      return field->default_value_enum()->number() == 0;
    case FieldDescriptor::CPPTYPE_INT32:
      return field->default_value_int32() == 0;
    case FieldDescriptor::CPPTYPE_INT64:
      return field->default_value_int64() == 0;
    case FieldDescriptor::CPPTYPE_UINT32:
      return field->default_value_uint32() == 0;
    case FieldDescriptor::CPPTYPE_UINT64:
      return field->default_value_uint64() == 0;
    case FieldDescriptor::CPPTYPE_FLOAT:
      return field->default_value_float() == 0;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return field->default_value_double() == 0;
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() == false;
    default:
      return false;
  }
}